

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_stack.hpp
# Opt level: O0

sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::detail::
sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::grow_(sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *this,size_t count,
       sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *t)

{
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  void *count_00;
  chunk *back;
  long lVar4;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  long *in_RDI;
  double dVar5;
  undefined1 auVar6 [16];
  size_t new_size_1;
  size_t new_size;
  chunk *in_stack_ffffffffffffff88;
  chunk *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  chunk *in_stack_ffffffffffffffb0;
  chunk *this_00;
  ulong local_30;
  unsigned_long local_28;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18 [3];
  
  if (*in_RDI == 0) {
    this_00 = (chunk *)0x100;
    std::max<unsigned_long>((unsigned_long *)local_18,(unsigned_long *)&stack0xffffffffffffffb0);
    back = (chunk *)operator_new(0x28);
    chunk::chunk(this_00,(size_t)in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,back,
                 in_stack_ffffffffffffff88);
    *in_RDI = (long)back;
  }
  else {
    *(long *)(*in_RDI + 8) = in_RDI[2];
    if ((*(long *)(*in_RDI + 0x20) != 0) &&
       (local_18[0] = in_RSI,
       psVar1 = (sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)chunk::size(*(chunk **)(*in_RDI + 0x20)), in_stack_ffffffffffffffa0 = in_RSI,
       in_RSI <= psVar1)) {
      *in_RDI = *(long *)(*in_RDI + 0x20);
      lVar4 = *(long *)*in_RDI + (long)local_18[0] * 0x28;
      *(long *)(*in_RDI + 8) = lVar4;
      in_RDI[2] = lVar4;
      in_RDI[3] = *(long *)(*in_RDI + 0x10);
      in_RDI[1] = *(long *)*in_RDI;
      std::
      fill_n<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>*,unsigned_long,boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                ((sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffffb0,(unsigned_long)in_RDI,in_RSI);
      return (sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_RDI[1];
    }
    sVar2 = chunk::size((chunk *)*in_RDI);
    auVar6._8_4_ = (int)(sVar2 >> 0x20);
    auVar6._0_8_ = sVar2;
    auVar6._12_4_ = 0x45300000;
    dVar5 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) * 1.5;
    local_30 = (ulong)dVar5;
    local_30 = local_30 | (long)(dVar5 - 9.223372036854776e+18) & (long)local_30 >> 0x3f;
    puVar3 = std::max<unsigned_long>((unsigned_long *)local_18,&local_30);
    local_28 = *puVar3;
    count_00 = operator_new(0x28);
    chunk::chunk(in_stack_ffffffffffffffb0,(size_t)in_RDI,in_stack_ffffffffffffffa0,(size_t)count_00
                 ,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    *in_RDI = (long)count_00;
  }
  in_RDI[1] = *(long *)*in_RDI;
  in_RDI[2] = *(long *)(*in_RDI + 8);
  in_RDI[3] = *(long *)(*in_RDI + 0x10);
  return (sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI[1];
}

Assistant:

T *grow_(std::size_t count, T const &t)
    {
        if(this->current_chunk_)
        {
            // write the cached value of current into the expr.
            // OK to do this even if later statements throw.
            this->current_chunk_->curr_ = this->curr_;

            // Do we have a expr with enough available memory already?
            if(this->current_chunk_->next_ && count <= this->current_chunk_->next_->size())
            {
                this->current_chunk_ = this->current_chunk_->next_;
                this->curr_ = this->current_chunk_->curr_ = this->current_chunk_->begin_ + count;
                this->end_ = this->current_chunk_->end_;
                this->begin_ = this->current_chunk_->begin_;
                std::fill_n(this->begin_, count, t);
                return this->begin_;
            }

            // grow exponentially
            std::size_t new_size = (std::max)(
                count
              , static_cast<std::size_t>(static_cast<double>(this->current_chunk_->size()) * 1.5)
            );

            // Create a new expr and insert it into the list
            this->current_chunk_ = new chunk(new_size, t, count, this->current_chunk_, this->current_chunk_->next_);
        }
        else
        {
            // first chunk is 256
            std::size_t new_size = (std::max)(count, static_cast<std::size_t>(256U));

            // Create a new expr and insert it into the list
            this->current_chunk_ = new chunk(new_size, t, count, 0, 0);
        }

        this->begin_ = this->current_chunk_->begin_;
        this->curr_ = this->current_chunk_->curr_;
        this->end_ = this->current_chunk_->end_;
        return this->begin_;
    }